

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

void __thiscall Potassco::AspifOutput::external(AspifOutput *this,Atom_t a,Value_t v)

{
  AspifOutput *this_00;
  undefined4 in_ESI;
  undefined8 in_RDI;
  E x;
  AspifOutput *in_stack_ffffffffffffffe0;
  Directive_t in_stack_ffffffffffffffe8;
  Directive_t r;
  Value_t local_4;
  
  x = (E)((ulong)in_RDI >> 0x20);
  r.val_ = x;
  Directive_t::Directive_t((Directive_t *)&stack0xffffffffffffffe8,External);
  startDir((AspifOutput *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8.val_),r);
  this_00 = add(in_stack_ffffffffffffffe0,x);
  Value_t::operator_cast_to_unsigned_int(&local_4);
  add(this_00,x);
  endDir(this_00);
  return;
}

Assistant:

void AspifOutput::external(Atom_t a, Value_t v) {
	startDir(Directive_t::External).add(static_cast<int>(a)).add(static_cast<int>(v)).endDir();
}